

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O2

int Bdc_ManDecompose(Bdc_Man_t *p,uint *puFunc,uint *puCare,int nVars,Vec_Ptr_t *vDivs,int nNodesMax
                    )

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  int iVar4;
  abctime aVar5;
  ulong uVar6;
  Bdc_Fun_t *pBVar7;
  abctime aVar8;
  uint uVar9;
  ulong uVar10;
  Bdc_Isf_t Isf;
  
  aVar5 = Abc_Clock();
  if (p->pPars->nVarsMax < nVars) {
    __assert_fail("nVars <= p->pPars->nVarsMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x127,
                  "int Bdc_ManDecompose(Bdc_Man_t *, unsigned int *, unsigned int *, int, Vec_Ptr_t *, int)"
                 );
  }
  p->nVars = nVars;
  uVar10 = 1;
  uVar9 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar9 = 1;
  }
  p->nWords = uVar9;
  p->nNodesMax = nNodesMax;
  Bdc_ManPrepare(p,vDivs);
  if (puCare == (uint *)0x0) {
    Bdc_IsfStart(p,&Isf);
    uVar6 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
    if (p->nVars < 6) {
      uVar6 = uVar10;
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      Isf.puOn[uVar6 - 1] = puFunc[uVar6 - 1];
    }
    uVar6 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
    if (p->nVars < 6) {
      uVar6 = uVar10;
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      Isf.puOff[uVar6 - 1] = ~puFunc[uVar6 - 1];
    }
  }
  else {
    uVar6 = (ulong)uVar9;
    do {
      if ((int)uVar6 < 1) {
        p->pRoot = (Bdc_Fun_t *)((ulong)p->pNodes ^ 1);
        return 0;
      }
      lVar3 = uVar6 - 1;
      uVar6 = uVar6 - 1;
    } while (puCare[lVar3] == 0);
    Bdc_IsfStart(p,&Isf);
    uVar6 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
    if (p->nVars < 6) {
      uVar6 = uVar10;
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      Isf.puOn[uVar6 - 1] = puFunc[uVar6 - 1] & puCare[uVar6 - 1];
    }
    uVar6 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
    if (p->nVars < 6) {
      uVar6 = uVar10;
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      Isf.puOff[uVar6 - 1] = ~puFunc[uVar6 - 1] & puCare[uVar6 - 1];
    }
  }
  Bdc_SuppMinimize(p,&Isf);
  pBVar7 = Bdc_ManDecompose_rec(p,&Isf);
  p->pRoot = pBVar7;
  aVar8 = Abc_Clock();
  p->timeTotal = p->timeTotal + (aVar8 - aVar5);
  uVar1 = p->numCalls;
  uVar2 = p->numNodes;
  p->numCalls = uVar1 + 1;
  p->numNodes = p->nNodesNew + uVar2;
  if (p->pRoot == (Bdc_Fun_t *)0x0) {
    iVar4 = -1;
  }
  else {
    iVar4 = Bdc_ManNodeVerify(p,&Isf,p->pRoot);
    if (iVar4 == 0) {
      puts("Bdc_ManDecompose(): Internal verification failed.");
    }
    iVar4 = p->nNodesNew;
  }
  return iVar4;
}

Assistant:

int Bdc_ManDecompose( Bdc_Man_t * p, unsigned * puFunc, unsigned * puCare, int nVars, Vec_Ptr_t * vDivs, int nNodesMax )
{
    Bdc_Isf_t Isf, * pIsf = &Isf;
    abctime clk = Abc_Clock();
    assert( nVars <= p->pPars->nVarsMax );
    // set current manager parameters
    p->nVars = nVars;
    p->nWords = Kit_TruthWordNum( nVars );
    p->nNodesMax = nNodesMax;
    Bdc_ManPrepare( p, vDivs );
    if ( puCare && Kit_TruthIsConst0( puCare, nVars ) )
    {
        p->pRoot = Bdc_Not(p->pNodes);
        return 0;
    }
    // copy the function
    Bdc_IsfStart( p, pIsf );
    if ( puCare )
    {
        Kit_TruthAnd( pIsf->puOn, puCare, puFunc, p->nVars );
        Kit_TruthSharp( pIsf->puOff, puCare, puFunc, p->nVars );
    }
    else
    {
        Kit_TruthCopy( pIsf->puOn, puFunc, p->nVars );
        Kit_TruthNot( pIsf->puOff, puFunc, p->nVars );
    }
    Bdc_SuppMinimize( p, pIsf );
    // call decomposition
    p->pRoot = Bdc_ManDecompose_rec( p, pIsf );
    p->timeTotal += Abc_Clock() - clk;
    p->numCalls++;
    p->numNodes += p->nNodesNew;
    if ( p->pRoot == NULL )
        return -1;
    if ( !Bdc_ManNodeVerify( p, pIsf, p->pRoot ) )
        printf( "Bdc_ManDecompose(): Internal verification failed.\n" );
//    assert( Bdc_ManNodeVerify( p, pIsf, p->pRoot ) );
    return p->nNodesNew;
}